

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_dist.c
# Opt level: O0

REF_BOOL ref_dist_exclude(REF_INT node0,REF_INT node1,REF_INT *nodes)

{
  REF_INT *nodes_local;
  REF_INT node1_local;
  REF_INT node0_local;
  
  if ((node0 == *nodes) && (node1 == nodes[1])) {
    node1_local = 1;
  }
  else if ((node0 == nodes[1]) && (node1 == nodes[2])) {
    node1_local = 1;
  }
  else if ((node0 == nodes[2]) && (node1 == *nodes)) {
    node1_local = 1;
  }
  else if ((node1 == *nodes) && (node0 == nodes[1])) {
    node1_local = 1;
  }
  else if ((node1 == nodes[1]) && (node0 == nodes[2])) {
    node1_local = 1;
  }
  else if ((node1 == nodes[2]) && (node0 == *nodes)) {
    node1_local = 1;
  }
  else {
    node1_local = 0;
  }
  return node1_local;
}

Assistant:

REF_FCN static REF_BOOL ref_dist_exclude(REF_INT node0, REF_INT node1,
                                         REF_INT *nodes) {
  if (node0 == nodes[0] && node1 == nodes[1]) return REF_TRUE;
  if (node0 == nodes[1] && node1 == nodes[2]) return REF_TRUE;
  if (node0 == nodes[2] && node1 == nodes[0]) return REF_TRUE;

  if (node1 == nodes[0] && node0 == nodes[1]) return REF_TRUE;
  if (node1 == nodes[1] && node0 == nodes[2]) return REF_TRUE;
  if (node1 == nodes[2] && node0 == nodes[0]) return REF_TRUE;

  return REF_FALSE;
}